

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void process_data_simple_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  JDIMENSION rowgroups_avail;
  my_main_ptr_conflict main_ptr;
  
  lVar2 = *(long *)(in_RDI + 0x228);
  if (*(int *)(lVar2 + 0x60) == 0) {
    iVar3 = (**(code **)(*(long *)(in_RDI + 0x230) + 0x18))(in_RDI,lVar2 + 0x10);
    if (iVar3 == 0) {
      return;
    }
    *(undefined4 *)(lVar2 + 0x60) = 1;
  }
  uVar1 = *(uint *)(in_RDI + 0x1a0);
  (**(code **)(*(long *)(in_RDI + 0x238) + 8))
            (in_RDI,lVar2 + 0x10,lVar2 + 100,uVar1,in_RSI,in_RDX,in_ECX);
  if (uVar1 <= *(uint *)(lVar2 + 100)) {
    *(undefined4 *)(lVar2 + 0x60) = 0;
    *(undefined4 *)(lVar2 + 100) = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main(j_decompress_ptr cinfo, JSAMPARRAY output_buf,
                         JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  JDIMENSION rowgroups_avail;

  /* Read input data if we haven't filled the main buffer yet */
  if (!main_ptr->buffer_full) {
    if (!(*cinfo->coef->decompress_data) (cinfo, main_ptr->buffer))
      return;                   /* suspension forced, can do nothing more */
    main_ptr->buffer_full = TRUE;       /* OK, we have an iMCU row to work with */
  }

  /* There are always min_DCT_scaled_size row groups in an iMCU row. */
  rowgroups_avail = (JDIMENSION)cinfo->_min_DCT_scaled_size;
  /* Note: at the bottom of the image, we may pass extra garbage row groups
   * to the postprocessor.  The postprocessor has to check for bottom
   * of image anyway (at row resolution), so no point in us doing it too.
   */

  /* Feed the postprocessor */
  (*cinfo->post->post_process_data) (cinfo, main_ptr->buffer,
                                     &main_ptr->rowgroup_ctr, rowgroups_avail,
                                     output_buf, out_row_ctr, out_rows_avail);

  /* Has postprocessor consumed all the data yet? If so, mark buffer empty */
  if (main_ptr->rowgroup_ctr >= rowgroups_avail) {
    main_ptr->buffer_full = FALSE;
    main_ptr->rowgroup_ctr = 0;
  }
}